

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_typed_array_subarray(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint32_t max;
  int64_t iVar1;
  int iVar2;
  JSObject *pJVar3;
  ulong uVar4;
  JSValue *argv_00;
  JSValue this_val_00;
  JSValue this_val_01;
  JSValue JVar5;
  JSValue JVar6;
  int final;
  uint local_98;
  int start;
  JSValueUnion local_90;
  ulong local_88;
  int64_t local_80;
  JSValueUnion local_78;
  int64_t local_70;
  JSValue local_68;
  ulong local_58;
  undefined8 local_50;
  ulong local_48;
  undefined8 local_40;
  
  local_80 = this_val.tag;
  JVar6.u = this_val.u;
  pJVar3 = get_typed_array(ctx,this_val,0);
  if (pJVar3 == (JSObject *)0x0) {
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  max = (pJVar3->u).array.count;
  argv_00 = (JSValue *)0x0;
  iVar2 = JS_ToInt32Clamp(ctx,&start,*argv,0,max,max);
  if (iVar2 == 0) {
    final = max;
    if ((int)argv[1].tag != 3) {
      argv_00 = (JSValue *)0x0;
      JVar5.tag = argv[1].tag;
      JVar5.u.ptr = argv[1].u.ptr;
      iVar2 = JS_ToInt32Clamp(ctx,&final,JVar5,0,max,max);
      if (iVar2 != 0) goto LAB_0015c3cb;
    }
    iVar1 = local_80;
    local_88 = (ulong)(uint)start;
    uVar4 = (ulong)(uint)(final - start);
    if (final - start < 1) {
      uVar4 = 0;
    }
    JVar6.tag = local_80;
    JVar5 = js_typed_array_get_byteOffset(ctx,JVar6,0);
    local_90 = JVar5.u;
    if ((int)JVar5.tag != 6) {
      local_98 = (uint)(byte)"includes"[(ulong)(pJVar3->field_0).header.dummy2 + 1];
      JS_FreeValue(ctx,JVar5);
      this_val_00.tag = iVar1;
      this_val_00.u.ptr = JVar6.u.ptr;
      JVar5 = js_typed_array_get_buffer(ctx,this_val_00,0);
      if ((int)JVar5.tag != 6) {
        local_58 = (ulong)(uint)(((int)local_88 << ((byte)local_98 & 0x1f)) + local_90._0_4_);
        local_70 = iVar1;
        local_50 = 0;
        local_40 = 0;
        this_val_01.tag = (int64_t)&local_78;
        this_val_01.u.float64 = 1.97626258336499e-323;
        local_78 = JVar6.u;
        local_68 = JVar5;
        local_48 = uVar4;
        JVar6 = js_typed_array___speciesCreate(ctx,this_val_01,(int)uVar4,argv_00);
        JS_FreeValue(ctx,JVar5);
        return JVar6;
      }
    }
  }
LAB_0015c3cb:
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_typed_array_subarray(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValueConst args[4];
    JSValue arr, byteOffset, ta_buffer;
    JSObject *p;
    int len, start, final, count, shift, offset;

    p = get_typed_array(ctx, this_val, 0);
    if (!p)
        goto exception;
    len = p->u.array.count;
    if (JS_ToInt32Clamp(ctx, &start, argv[0], 0, len, len))
        goto exception;

    final = len;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &final, argv[1], 0, len, len))
            goto exception;
    }
    count = max_int(final - start, 0);
    byteOffset = js_typed_array_get_byteOffset(ctx, this_val, 0);
    if (JS_IsException(byteOffset))
        goto exception;
    shift = typed_array_size_log2(p->class_id);
    offset = JS_VALUE_GET_INT(byteOffset) + (start << shift);
    JS_FreeValue(ctx, byteOffset);
    ta_buffer = js_typed_array_get_buffer(ctx, this_val, 0);
    if (JS_IsException(ta_buffer))
        goto exception;
    args[0] = this_val;
    args[1] = ta_buffer;
    args[2] = JS_NewInt32(ctx, offset);
    args[3] = JS_NewInt32(ctx, count);
    arr = js_typed_array___speciesCreate(ctx, JS_UNDEFINED, 4, args);
    JS_FreeValue(ctx, ta_buffer);
    return arr;

 exception:
    return JS_EXCEPTION;
}